

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_client.cpp
# Opt level: O0

int __thiscall zmq::plain_client_t::process_handshake_command(plain_client_t *this,msg_t *msg_)

{
  int iVar1;
  plain_client_t *this_00;
  uchar *cmd_data_;
  int *piVar2;
  char *pcVar3;
  msg_t *in_RSI;
  plain_client_t *in_RDI;
  char *errstr_1;
  char *errstr;
  int rc;
  size_t data_size;
  uchar *cmd_data;
  endpoint_uri_pair_t *in_stack_ffffffffffffffc8;
  socket_base_t *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  plain_client_t *this_01;
  
  this_01 = in_RDI;
  this_00 = (plain_client_t *)msg_t::data((msg_t *)in_stack_ffffffffffffffc8);
  cmd_data_ = (uchar *)msg_t::size((msg_t *)in_stack_ffffffffffffffc8);
  uVar4 = 0;
  if ((cmd_data_ < (uchar *)0x8) ||
     ((this_00->super_mechanism_base_t).super_mechanism_t._vptr_mechanism_t !=
      (_func_int **)0x454d4f434c455707)) {
    if ((cmd_data_ < (uchar *)0x6) || (iVar1 = memcmp(this_00,&ready_prefix,6), iVar1 != 0)) {
      if ((cmd_data_ < (uchar *)0x5) || (iVar1 = memcmp(this_00,"^RROR",5), iVar1 != 0)) {
        session_base_t::get_socket((in_RDI->super_mechanism_base_t).session);
        iVar1 = (int)((ulong)in_RDI >> 0x20);
        this_00 = (plain_client_t *)session_base_t::get_endpoint((session_base_t *)0x3176d9);
        socket_base_t::event_handshake_failed_protocol
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,iVar1);
        piVar2 = __errno_location();
        *piVar2 = 0x47;
        iVar1 = -1;
      }
      else {
        iVar1 = process_error(this_01,(uchar *)in_RSI,(size_t)this_00);
      }
    }
    else {
      iVar1 = process_ready(this_00,cmd_data_,CONCAT44(uVar4,in_stack_ffffffffffffffd8));
    }
  }
  else {
    iVar1 = process_welcome((plain_client_t *)(ulong)in_stack_ffffffffffffffd8,
                            (uchar *)in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
  }
  if (iVar1 == 0) {
    iVar1 = msg_t::close(in_RSI,(int)this_00);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      this_00 = (plain_client_t *)0x32b5b5;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
              ,0x62);
      fflush(_stderr);
      zmq_abort((char *)0x31777e);
    }
    iVar1 = msg_t::init(in_RSI,(EVP_PKEY_CTX *)this_00);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
              ,100);
      fflush(_stderr);
      zmq_abort((char *)0x3177f2);
    }
  }
  return iVar1;
}

Assistant:

int zmq::plain_client_t::process_handshake_command (msg_t *msg_)
{
    const unsigned char *cmd_data =
      static_cast<unsigned char *> (msg_->data ());
    const size_t data_size = msg_->size ();

    int rc = 0;
    if (data_size >= welcome_prefix_len
        && !memcmp (cmd_data, welcome_prefix, welcome_prefix_len))
        rc = process_welcome (cmd_data, data_size);
    else if (data_size >= ready_prefix_len
             && !memcmp (cmd_data, ready_prefix, ready_prefix_len))
        rc = process_ready (cmd_data, data_size);
    else if (data_size >= error_prefix_len
             && !memcmp (cmd_data, error_prefix, error_prefix_len))
        rc = process_error (cmd_data, data_size);
    else {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNEXPECTED_COMMAND);
        errno = EPROTO;
        rc = -1;
    }

    if (rc == 0) {
        rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
    }

    return rc;
}